

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

string * __thiscall CS248::Application::info_abi_cxx11_(Application *this)

{
  code *pcVar1;
  long in_RSI;
  string *in_RDI;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11 [17];
  
  switch(*(undefined4 *)(in_RSI + 0xc)) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"MeshEdit",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
    break;
  case 1:
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"PathTracer",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Animation",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return in_RDI;
}

Assistant:

string Application::info() {
  switch (mode) {
    case MODEL_MODE:
      return "MeshEdit";
      break;
    case ANIMATE_MODE:
      return "Animation";
      break;
    case RENDER_MODE:
    case VISUALIZE_MODE:
      return "PathTracer";
      break;
  }
}